

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O0

sbfQueueItem sbfQueue_getItem(sbfQueue queue,sbfQueueCb cb,void *closure)

{
  sbfQueueItem psVar1;
  void *in_RDX;
  sbfQueueCb in_RSI;
  sbfQueueItem item;
  sbfPool in_stack_ffffffffffffffe0;
  
  psVar1 = (sbfQueueItem)sbfPool_get(in_stack_ffffffffffffffe0);
  psVar1->mCb = in_RSI;
  psVar1->mClosure = in_RDX;
  return psVar1;
}

Assistant:

sbfQueueItem
sbfQueue_getItem (sbfQueue queue, sbfQueueCb cb, void* closure)
{
    sbfQueueItem item;

    item = sbfPool_get (queue->mPool);
    item->mCb = cb;
    item->mClosure = closure;
    return item;
}